

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMapKey
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FieldDescriptorProto *pFVar1;
  bool bVar2;
  CppType CVar3;
  string *psVar4;
  FieldOptions *this_00;
  anon_union_8_7_bfa3a334_for_Symbol_2 name;
  string *__rhs;
  Symbol SVar5;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  FieldDescriptor *local_190;
  FieldDescriptor *key_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  Symbol key_symbol;
  string *key_name;
  string local_a8;
  Descriptor *local_88;
  Descriptor *item_type;
  string local_78;
  allocator<char> local_41;
  string local_40;
  FieldDescriptorProto *local_20;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  local_20 = proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  bVar2 = FieldDescriptor::is_repeated(field);
  if (bVar2) {
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)proto_local);
    if (CVar3 == CPPTYPE_MESSAGE) {
      local_88 = FieldDescriptor::message_type((FieldDescriptor *)proto_local);
      if (local_88 == (Descriptor *)0x0) {
        psVar4 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
        pFVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"Could not find field type.",
                   (allocator<char> *)((long)&key_name + 7));
        AddError(this,psVar4,&pFVar1->super_Message,TYPE,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&key_name + 7));
      }
      else {
        this_00 = FieldDescriptor::options((FieldDescriptor *)proto_local);
        name.descriptor = (Descriptor *)FieldOptions::experimental_map_key_abi_cxx11_(this_00);
        key_symbol.field_1.descriptor = name.descriptor;
        psVar4 = Descriptor::full_name_abi_cxx11_(local_88);
        std::operator+(&local_108,psVar4,".");
        std::operator+(&local_e8,&local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       key_symbol.field_1.descriptor);
        SVar5 = LookupSymbol(this,(string *)name.descriptor,&local_e8,PLACEHOLDER_MESSAGE,LOOKUP_ALL
                            );
        key_symbol._0_8_ = SVar5.field_1;
        local_c8._0_4_ = SVar5.type;
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        bVar2 = anon_unknown_1::Symbol::IsNull((Symbol *)local_c8);
        if ((!bVar2) &&
           (bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)key_symbol._0_8_), !bVar2)) {
          local_190 = (FieldDescriptor *)key_symbol._0_8_;
          bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)key_symbol._0_8_);
          if (bVar2) {
            psVar4 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
            pFVar1 = local_20;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b0,"map_key must not name a repeated field.",&local_1b1);
            AddError(this,psVar4,&pFVar1->super_Message,TYPE,&local_1b0);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::allocator<char>::~allocator(&local_1b1);
            return;
          }
          CVar3 = FieldDescriptor::cpp_type(local_190);
          if (CVar3 == CPPTYPE_MESSAGE) {
            psVar4 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
            pFVar1 = local_20;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d8,"map key must name a scalar or string field.",&local_1d9
                      );
            AddError(this,psVar4,&pFVar1->super_Message,TYPE,&local_1d8);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::allocator<char>::~allocator(&local_1d9);
            return;
          }
          proto_local[1]._unknown_fields_.fields_ =
               (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                *)local_190;
          return;
        }
        psVar4 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
        pFVar1 = local_20;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &key_field,"Could not find field named \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       key_symbol.field_1.descriptor);
        std::operator+(&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &key_field,"\" in type \"");
        __rhs = Descriptor::full_name_abi_cxx11_(local_88);
        std::operator+(&local_148,&local_168,__rhs);
        std::operator+(&local_128,&local_148,"\".");
        AddError(this,psVar4,&pFVar1->super_Message,TYPE,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&key_field);
      }
    }
    else {
      psVar4 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
      pFVar1 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"map type is only allowed for fields with a message type.",
                 (allocator<char> *)((long)&item_type + 7));
      AddError(this,psVar4,&pFVar1->super_Message,TYPE,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&item_type + 7));
    }
  }
  else {
    psVar4 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
    pFVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"map type is only allowed for repeated fields.",&local_41);
    AddError(this,psVar4,&pFVar1->super_Message,TYPE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMapKey(FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  if (!field->is_repeated()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map type is only allowed for repeated fields.");
    return;
  }

  if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map type is only allowed for fields with a message type.");
    return;
  }

  const Descriptor* item_type = field->message_type();
  if (item_type == NULL) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Could not find field type.");
    return;
  }

  // Find the field in item_type named by "experimental_map_key"
  const string& key_name = field->options().experimental_map_key();
  const Symbol key_symbol = LookupSymbol(
      key_name,
      // We append ".key_name" to the containing type's name since
      // LookupSymbol() searches for peers of the supplied name, not
      // children of the supplied name.
      item_type->full_name() + "." + key_name);

  if (key_symbol.IsNull() || key_symbol.field_descriptor->is_extension()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Could not find field named \"" + key_name + "\" in type \"" +
             item_type->full_name() + "\".");
    return;
  }
  const FieldDescriptor* key_field = key_symbol.field_descriptor;

  if (key_field->is_repeated()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map_key must not name a repeated field.");
    return;
  }

  if (key_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map key must name a scalar or string field.");
    return;
  }

  field->experimental_map_key_ = key_field;
}